

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

bool __thiscall re2::CharClassBuilder::Contains(CharClassBuilder *this,Rune r)

{
  bool bVar1;
  _Self local_30;
  RuneRange local_28;
  _Self local_20;
  Rune local_14;
  CharClassBuilder *pCStack_10;
  Rune r_local;
  CharClassBuilder *this_local;
  
  local_14 = r;
  pCStack_10 = this;
  RuneRange::RuneRange(&local_28,r,r);
  local_20._M_node =
       (_Base_ptr)
       std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::find
                 (&this->ranges_,&local_28);
  local_30._M_node = (_Base_ptr)end(this);
  bVar1 = std::operator!=(&local_20,&local_30);
  return bVar1;
}

Assistant:

bool CharClassBuilder::Contains(Rune r) {
  return ranges_.find(RuneRange(r, r)) != end();
}